

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

double __thiscall gmath::OrthoCamera::projectPoint(OrthoCamera *this,Vector2d *p,Vector3d *Pw)

{
  _func_int **pp_Var1;
  double *pdVar2;
  SVector<double,_2> *in_RSI;
  Camera *in_RDI;
  double dVar3;
  Vector3d Pc;
  SVector<double,_3> *in_stack_ffffffffffffff60;
  SVector<double,_3> *in_stack_ffffffffffffff70;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffff78;
  SVector<double,_3> local_30;
  SVector<double,_2> *local_10;
  
  local_10 = in_RSI;
  Camera::getR(in_RDI);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_RDI);
  Camera::getT(in_RDI);
  SVector<double,_3>::operator-((SVector<double,_3> *)in_RDI,in_stack_ffffffffffffff60);
  SMatrix<double,_3,_3>::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pdVar2 = SVector<double,_3>::operator[](&local_30,0);
  dVar3 = *pdVar2;
  pp_Var1 = in_RDI[1]._vptr_Camera;
  pdVar2 = SVector<double,_2>::operator[](local_10,0);
  *pdVar2 = dVar3 / (double)pp_Var1;
  pdVar2 = SVector<double,_3>::operator[](&local_30,1);
  dVar3 = -*pdVar2 / (double)in_RDI[1]._vptr_Camera;
  pdVar2 = SVector<double,_2>::operator[](local_10,1);
  *pdVar2 = dVar3;
  pdVar2 = SVector<double,_3>::operator[](&local_30,2);
  return *pdVar2 / *(double *)&in_RDI[1].name;
}

Assistant:

double OrthoCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  Vector3d Pc=transpose(getR())*(Pw-getT());

  p[0]=Pc[0]/res;
  p[1]=-Pc[1]/res;

  return Pc[2]/dres;
}